

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_ObjCreate(Wlc_Ntk_t *p,int Type,int Signed,int End,int Beg,Vec_Int_t *vFanins)

{
  uint uVar1;
  
  uVar1 = Wlc_ObjAlloc(p,Type,Signed,End,Beg);
  if ((0 < (int)uVar1) && ((int)uVar1 < p->nObjsAlloc)) {
    Wlc_ObjAddFanins(p,p->pObjs + uVar1,vFanins);
    return uVar1;
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

int Wlc_ObjCreate( Wlc_Ntk_t * p, int Type, int Signed, int End, int Beg, Vec_Int_t * vFanins )
{
    int iFaninNew = Wlc_ObjAlloc( p, Type, Signed, End, Beg );
    Wlc_ObjAddFanins( p, Wlc_NtkObj(p, iFaninNew), vFanins );
    return iFaninNew;
}